

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O0

void __thiscall
cppcms::impl::cgi::connection::async_prepare_request(connection *this,context *context,ehandler *h)

{
  bool bVar1;
  level_type lVar2;
  ulong uVar3;
  ostream *poVar4;
  callback *pcVar5;
  shared_ptr<cppcms::impl::cgi::connection> *in_RDI;
  error_code e;
  connection *in_stack_fffffffffffffed8;
  error_code *in_stack_fffffffffffffee0;
  callback<void_(const_std::error_code_&)> *this_00;
  error_code *in_stack_fffffffffffffef8;
  ostream *in_stack_ffffffffffffff00;
  message *in_stack_ffffffffffffff08;
  context **in_stack_ffffffffffffff10;
  callback<void_(const_std::error_code_&)> local_d0 [3];
  undefined1 local_b8 [12];
  undefined4 local_ac;
  byte local_91;
  string local_90 [55];
  byte local_59;
  message local_58 [48];
  error_code local_28 [2];
  
  std::error_code::error_code(in_stack_fffffffffffffee0);
  bVar1 = (bool)(**(code **)&(((in_RDI->
                               super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->pending_output_).
                             super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10)();
  booster::aio::basic_io_device::set_non_blocking(bVar1,(error_code *)0x1);
  bVar1 = std::error_code::operator_cast_to_bool(local_28);
  if (bVar1) {
    lVar2 = booster::log::logger::instance();
    uVar3 = booster::log::logger::should_be_logged(lVar2,(char *)0x28);
    local_59 = 0;
    local_91 = 0;
    if ((uVar3 & 1) != 0) {
      in_stack_ffffffffffffff08 = local_58;
      booster::log::message::message
                (in_stack_ffffffffffffff08,warning,"cppcms",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/cgi_api.cpp"
                 ,0xba);
      local_59 = 1;
      poVar4 = (ostream *)booster::log::message::out();
      in_stack_ffffffffffffff00 =
           std::operator<<(poVar4,"Failed to set nonblocking mode in socket ");
      std::error_code::message_abi_cxx11_(in_stack_fffffffffffffef8);
      local_91 = 1;
      poVar4 = std::operator<<(in_stack_ffffffffffffff00,local_90);
      std::ios::operator_cast_to_bool(poVar4 + *(long *)(*(long *)poVar4 + -0x18));
    }
    if ((local_91 & 1) != 0) {
      std::__cxx11::string::~string(local_90);
    }
    if ((local_59 & 1) != 0) {
      booster::log::message::~message(local_58);
    }
    pcVar5 = (callback *)
             (**(code **)&(((in_RDI->
                            super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr)->pending_output_).
                          super__Vector_base<char,_std::allocator<char>_>._M_impl)();
    local_ac = 1;
    func_to_handler<booster::callback<void(cppcms::http::context::completion_type)>,cppcms::http::context::completion_type>
              ((callback<void_(cppcms::http::context::completion_type)> *)in_stack_ffffffffffffff08,
               (anon_enum_32 *)in_stack_ffffffffffffff00);
    booster::callback<void()>::callback<booster::callable<void()>>
              ((callback<void_()> *)in_stack_fffffffffffffee0,
               (intrusive_ptr<booster::callable<void_()>_> *)in_stack_fffffffffffffed8);
    booster::aio::io_service::post(pcVar5);
    booster::callback<void_()>::~callback((callback<void_()> *)0x37cdae);
    booster::intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr
              ((intrusive_ptr<booster::callable<void_()>_> *)in_stack_fffffffffffffee0);
  }
  else {
    this_00 = local_d0;
    self(in_stack_fffffffffffffed8);
    mfunc_to_event_handler<cppcms::impl::cgi::connection,std::shared_ptr<cppcms::impl::cgi::connection>,cppcms::http::context*,booster::callback<void(cppcms::http::context::completion_type)>const&,cppcms::http::context*,booster::callback<void(cppcms::http::context::completion_type)>>
              ((offset_in_connection_to_subr)on_headers_read,in_RDI,in_stack_ffffffffffffff10,
               (callback<void_(cppcms::http::context::completion_type)> *)in_stack_ffffffffffffff08)
    ;
    booster::callback<void(std::error_code_const&)>::
    callback<booster::callable<void(std::error_code_const&)>>
              (this_00,(intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)
                       in_stack_fffffffffffffed8);
    (*(code *)((in_RDI->
               super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              )->service_)(in_RDI,local_b8);
    booster::callback<void_(const_std::error_code_&)>::~callback
              ((callback<void_(const_std::error_code_&)> *)0x37cef0);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (&this_00->call_ptr);
    std::shared_ptr<cppcms::impl::cgi::connection>::~shared_ptr
              ((shared_ptr<cppcms::impl::cgi::connection> *)0x37cf04);
  }
  return;
}

Assistant:

void connection::async_prepare_request(	http::context *context,
					ehandler const &h)
{
	booster::system::error_code e;
	socket().set_non_blocking(true,e);
	if(e) {
		BOOSTER_WARNING("cppcms") << "Failed to set nonblocking mode in socket " << e.message();
		get_io_service().post(func_to_handler(h,http::context::operation_aborted));
		return;
	}
	async_read_headers(mfunc_to_event_handler(&connection::on_headers_read,self(),context,h));
}